

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

int sign_certificate(ptls_sign_certificate_t *_self,ptls_t *tls,ptls_async_job_t **async,
                    uint16_t *selected_algorithm,ptls_buffer_t *outbuf,ptls_iovec_t input,
                    uint16_t *algorithms,size_t num_algorithms)

{
  uint16_t uVar1;
  EVP_PKEY *pkey;
  uint8_t *puVar2;
  int iVar3;
  int iVar4;
  EVP_MD *type;
  EVP_MD_CTX *ctx;
  ptls_async_job_t *ppVar5;
  ptls_buffer_t *ppVar6;
  int iVar7;
  size_t sVar8;
  ptls_openssl_signature_scheme_t *scheme;
  ptls_openssl_signature_scheme_t *scheme_00;
  size_t siglen;
  size_t local_58;
  size_t local_50;
  ptls_buffer_t *local_48;
  EVP_PKEY_CTX *local_40;
  uint8_t *local_38;
  
  if ((async != (ptls_async_job_t **)0x0) && (*async != (ptls_async_job_t *)0x0)) {
    *selected_algorithm = *(uint16_t *)(*async)[1].destroy_;
    iVar3 = do_sign_async(outbuf,async);
    return iVar3;
  }
  scheme_00 = (ptls_openssl_signature_scheme_t *)_self[2].cb;
  uVar1 = scheme_00->scheme_id;
  do {
    if (uVar1 == 0xffff) {
      return 0x28;
    }
    if (num_algorithms != 0) {
      sVar8 = 0;
      do {
        if (algorithms[sVar8] == uVar1) {
          *selected_algorithm = uVar1;
          local_48 = outbuf;
          if ((async != (ptls_async_job_t **)0x0) && (((ulong)_self[3].cb & 1) == 0)) {
            if (*async != (ptls_async_job_t *)0x0) {
              __assert_fail("*async == NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/openssl.c"
                            ,0x5ea,
                            "int sign_certificate(ptls_sign_certificate_t *, ptls_t *, ptls_async_job_t **, uint16_t *, ptls_buffer_t *, ptls_iovec_t, const uint16_t *, size_t)"
                           );
            }
            async = (ptls_async_job_t **)0x0;
          }
          pkey = (EVP_PKEY *)_self[1].cb;
          local_38 = input.base;
          if (scheme_00->scheme_md == (_func_EVP_MD_ptr *)0x0) {
            type = (EVP_MD *)0x0;
          }
          else {
            type = (EVP_MD *)(*scheme_00->scheme_md)();
          }
          ctx = (EVP_MD_CTX *)EVP_MD_CTX_new();
          if (ctx == (EVP_MD_CTX *)0x0) {
            return 0x201;
          }
          local_50 = input.len;
          iVar4 = EVP_DigestSignInit(ctx,&local_40,type,(ENGINE *)0x0,pkey);
          iVar7 = 0x203;
          iVar3 = iVar7;
          if (iVar4 != 1) goto LAB_00122557;
          iVar4 = EVP_PKEY_get_id(pkey);
          puVar2 = local_38;
          if (iVar4 == 0x43f) {
            iVar4 = EVP_DigestSign(ctx,0,&local_58,local_38,local_50);
            ppVar6 = local_48;
            if ((iVar4 != 1) || (iVar3 = ptls_buffer_reserve(local_48,local_58), iVar3 != 0))
            goto LAB_00122557;
            iVar4 = EVP_DigestSign(ctx,ppVar6->base + ppVar6->off,&local_58,puVar2,local_50);
          }
          else {
            iVar4 = EVP_PKEY_get_id(pkey);
            if (((iVar4 == 6) &&
                (((iVar4 = EVP_PKEY_CTX_set_rsa_padding(local_40,6), iVar4 != 1 ||
                  (iVar4 = EVP_PKEY_CTX_set_rsa_pss_saltlen(local_40,0xffffffff), iVar4 != 1)) ||
                 (iVar4 = EVP_PKEY_CTX_set_rsa_mgf1_md(local_40,type), iVar4 != 1)))) ||
               ((iVar4 = EVP_DigestSignUpdate(ctx,local_38,local_50), iVar4 != 1 ||
                (iVar4 = EVP_DigestSignFinal(ctx,(uchar *)0x0,&local_58), ppVar6 = local_48,
                iVar4 != 1)))) goto LAB_00122557;
            if (async != (ptls_async_job_t **)0x0) {
              ppVar5 = async_sign_ctx_new(scheme_00,(EVP_MD_CTX *)ctx,local_58);
              *async = ppVar5;
              if (ppVar5 != (ptls_async_job_t *)0x0) {
                iVar3 = do_sign_async(local_48,async);
                return iVar3;
              }
              iVar3 = 0x201;
              goto LAB_00122557;
            }
            iVar3 = ptls_buffer_reserve(local_48,local_58);
            if (iVar3 != 0) goto LAB_00122557;
            iVar4 = EVP_DigestSignFinal(ctx,ppVar6->base + ppVar6->off,&local_58);
          }
          iVar3 = iVar7;
          if (iVar4 == 1) {
            ppVar6->off = ppVar6->off + local_58;
            iVar3 = 0;
          }
LAB_00122557:
          EVP_MD_CTX_free(ctx);
          return iVar3;
        }
        sVar8 = sVar8 + 1;
      } while (num_algorithms != sVar8);
    }
    uVar1 = scheme_00[1].scheme_id;
    scheme_00 = scheme_00 + 1;
  } while( true );
}

Assistant:

static int sign_certificate(ptls_sign_certificate_t *_self, ptls_t *tls, ptls_async_job_t **async, uint16_t *selected_algorithm,
                            ptls_buffer_t *outbuf, ptls_iovec_t input, const uint16_t *algorithms, size_t num_algorithms)
{
    ptls_openssl_sign_certificate_t *self = (ptls_openssl_sign_certificate_t *)_self;
    const ptls_openssl_signature_scheme_t *scheme;

    /* Just resume the asynchronous operation, if one is in flight. */
#if PTLS_OPENSSL_HAVE_ASYNC
    if (async != NULL && *async != NULL) {
        struct async_sign_ctx *sign_ctx = (struct async_sign_ctx *)(*async);
        *selected_algorithm = sign_ctx->scheme->scheme_id;
        return do_sign_async(outbuf, async);
    }
#endif

    /* Select the algorithm or return failure if none found. */
    if ((scheme = ptls_openssl_select_signature_scheme(self->schemes, algorithms, num_algorithms)) == NULL)
        return PTLS_ALERT_HANDSHAKE_FAILURE;
    *selected_algorithm = scheme->scheme_id;

#if PTLS_OPENSSL_HAVE_ASYNC
    if (!self->async && async != NULL) {
        /* indicate to `do_sign` that async mode is disabled for this operation */
        assert(*async == NULL);
        async = NULL;
    }
#endif
    return do_sign(self->key, scheme, outbuf, input, async);
}